

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

void __thiscall rpc_tests::rpc_createraw_op_return::test_method(rpc_createraw_op_return *this)

{
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 uVar4;
  check_type cVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffaf8;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_2f8;
  char *local_2f0;
  lazy_ostream local_2e8;
  undefined1 *local_2d8;
  char *local_2d0;
  assertion_result local_2c8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  long *local_290 [2];
  long local_280 [2];
  UniValue local_270;
  long *local_218 [2];
  long local_208 [2];
  UniValue local_1f8;
  long *local_1a0 [2];
  long local_190 [2];
  UniValue local_180;
  long *local_128 [2];
  long local_118 [2];
  UniValue local_108;
  long *local_b0 [2];
  long local_a0 [2];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"68656c6c6f776f726c64\"}"
             ,"");
  args._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffaec;
  args._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffae8;
  args._M_string_length = (size_type)_cVar5;
  args.field_2 = in_stack_fffffffffffffaf8;
  RPCTestingSetup::CallRPC(&local_90,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xd6;
  file.m_begin = (iterator)&local_2a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b0,msg);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8.m_empty = false;
  local_2e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138c3c0;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "no exceptions thrown by CallRPC(\"createrawtransaction [{\\\"txid\\\":\\\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\\\",\\\"vout\\\":0}] {\\\"data\\\":\\\"68656c6c6f776f726c64\\\"}\")"
  ;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2f0 = "";
  uVar3 = 0;
  uVar4 = 0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_2e8,1,1,WARN,_cVar5,(size_t)&local_2f8,0xd6);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xd9;
  file_00.m_begin = (iterator)&local_338;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_348,
             msg_00);
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,
             "createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"somedata\":\"68656c6c6f776f726c64\"}"
             ,"");
  args_00._M_dataplus._M_p._4_4_ = uVar4;
  args_00._M_dataplus._M_p._0_4_ = uVar3;
  args_00._M_string_length = (size_type)_cVar5;
  args_00.field_2 = in_stack_fffffffffffffaf8;
  RPCTestingSetup::CallRPC(&local_108,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.val._M_dataplus._M_p != &local_108.val.field_2) {
    operator_delete(local_108.val._M_dataplus._M_p,local_108.val.field_2._M_allocated_capacity + 1);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xd9;
  file_01.m_begin = (iterator)&local_358;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_368,
             msg_01);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8.m_empty = false;
  local_2e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389858;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = "exception std::runtime_error expected but not raised";
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_370 = "";
  uVar3 = 0;
  uVar4 = 0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_2e8,1,1,WARN,_cVar5,(size_t)&local_378,0xd9);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xdc;
  file_02.m_begin = (iterator)&local_3b8;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3c8,
             msg_02);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,
             "createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"12345\"}"
             ,"");
  args_01._M_dataplus._M_p._4_4_ = uVar4;
  args_01._M_dataplus._M_p._0_4_ = uVar3;
  args_01._M_string_length = (size_type)_cVar5;
  args_01.field_2 = in_stack_fffffffffffffaf8;
  RPCTestingSetup::CallRPC(&local_180,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.val._M_dataplus._M_p != &local_180.val.field_2) {
    operator_delete(local_180.val._M_dataplus._M_p,local_180.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xdc;
  file_03.m_begin = (iterator)&local_3d8;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3e8,
             msg_03);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8.m_empty = false;
  local_2e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389858;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = "exception std::runtime_error expected but not raised";
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3f0 = "";
  uVar3 = 0;
  uVar4 = 0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_2e8,1,1,WARN,_cVar5,(size_t)&local_3f8,0xdc);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xdd;
  file_04.m_begin = (iterator)&local_438;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_448,
             msg_04);
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,
             "createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"12345g\"}"
             ,"");
  args_02._M_dataplus._M_p._4_4_ = uVar4;
  args_02._M_dataplus._M_p._0_4_ = uVar3;
  args_02._M_string_length = (size_type)_cVar5;
  args_02.field_2 = in_stack_fffffffffffffaf8;
  RPCTestingSetup::CallRPC(&local_1f8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.val._M_dataplus._M_p != &local_1f8.val.field_2) {
    operator_delete(local_1f8.val._M_dataplus._M_p,local_1f8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xdd;
  file_05.m_begin = (iterator)&local_458;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_468,
             msg_05);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8.m_empty = false;
  local_2e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389858;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = "exception std::runtime_error expected but not raised";
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_470 = "";
  uVar3 = 0;
  uVar4 = 0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_2e8,1,1,WARN,_cVar5,(size_t)&local_478,0xdd);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,
             "createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081\"}"
             ,"");
  args_03._M_dataplus._M_p._4_4_ = uVar4;
  args_03._M_dataplus._M_p._0_4_ = uVar3;
  args_03._M_string_length = (size_type)_cVar5;
  args_03.field_2 = in_stack_fffffffffffffaf8;
  RPCTestingSetup::CallRPC(&local_270,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != &local_270.val.field_2) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xe0;
  file_06.m_begin = (iterator)&local_4b8;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4c8,
             msg_06);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e8.m_empty = false;
  local_2e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138c440;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "no exceptions thrown by CallRPC(\"createrawtransaction [{\\\"txid\\\":\\\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\\\",\\\"vout\\\":0}] {\\\"data\\\":\\\"010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081\\\"}\")"
  ;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4d0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_2e8,1,1,WARN,_cVar5,(size_t)&local_4d8,0xe0);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_createraw_op_return)
{
    BOOST_CHECK_NO_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"68656c6c6f776f726c64\"}"));

    // Key not "data" (bad address)
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"somedata\":\"68656c6c6f776f726c64\"}"), std::runtime_error);

    // Bad hex encoding of data output
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"12345\"}"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"12345g\"}"), std::runtime_error);

    // Data 81 bytes long
    BOOST_CHECK_NO_THROW(CallRPC("createrawtransaction [{\"txid\":\"a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed\",\"vout\":0}] {\"data\":\"010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081\"}"));
}